

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64.h
# Opt level: O0

void fiat_25519_sub(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t *arg2_local;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  uVar1 = arg1[1];
  uVar2 = arg2[1];
  uVar3 = arg1[2];
  uVar4 = arg2[2];
  uVar5 = arg1[3];
  uVar6 = arg2[3];
  uVar7 = arg1[4];
  uVar8 = arg2[4];
  *out1 = (*arg1 + 0xfffffffffffda) - *arg2;
  out1[1] = (uVar1 + 0xffffffffffffe) - uVar2;
  out1[2] = (uVar3 + 0xffffffffffffe) - uVar4;
  out1[3] = (uVar5 + 0xffffffffffffe) - uVar6;
  out1[4] = (uVar7 + 0xffffffffffffe) - uVar8;
  return;
}

Assistant:

static FIAT_25519_FIAT_INLINE void fiat_25519_sub(fiat_25519_loose_field_element out1, const fiat_25519_tight_field_element arg1, const fiat_25519_tight_field_element arg2) {
  uint64_t x1;
  uint64_t x2;
  uint64_t x3;
  uint64_t x4;
  uint64_t x5;
  x1 = ((UINT64_C(0xfffffffffffda) + (arg1[0])) - (arg2[0]));
  x2 = ((UINT64_C(0xffffffffffffe) + (arg1[1])) - (arg2[1]));
  x3 = ((UINT64_C(0xffffffffffffe) + (arg1[2])) - (arg2[2]));
  x4 = ((UINT64_C(0xffffffffffffe) + (arg1[3])) - (arg2[3]));
  x5 = ((UINT64_C(0xffffffffffffe) + (arg1[4])) - (arg2[4]));
  out1[0] = x1;
  out1[1] = x2;
  out1[2] = x3;
  out1[3] = x4;
  out1[4] = x5;
}